

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int define_kf_interval(AV1_COMP *cpi,FIRSTPASS_INFO *firstpass_info,
                      int num_frames_to_detect_scenecut,int search_start_idx)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  aom_rc_mode aVar5;
  AV1_PRIMARY *pAVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  FIRSTPASS_INFO *firstpass_info_00;
  FIRSTPASS_STATS *pFVar14;
  FIRSTPASS_STATS *pFVar15;
  FIRSTPASS_STATS *pFVar16;
  uint uVar17;
  uint frame_interval;
  uint uVar18;
  long lVar19;
  int iVar20;
  int offset_from_cur;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double recent_loop_decay [8];
  
  pAVar6 = cpi->ppi;
  iVar12 = (cpi->rc).frames_since_key;
  iVar8 = detect_app_forced_key(cpi);
  if (num_frames_to_detect_scenecut == 0) {
    if (iVar8 == -1) {
      iVar8 = (cpi->rc).frames_to_key;
    }
  }
  else {
    iVar20 = num_frames_to_detect_scenecut;
    if (iVar8 < num_frames_to_detect_scenecut) {
      iVar20 = iVar8;
    }
    for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
      recent_loop_decay[lVar19] = 1.0;
    }
    if (iVar8 == -1) {
      iVar20 = num_frames_to_detect_scenecut;
    }
    piVar13 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar13 = &(cpi->common).mi_params.MBs;
    }
    iVar3 = *piVar13;
    iVar9 = av1_firstpass_info_future_count(firstpass_info,0);
    frame_interval = 0;
    if (iVar9 < iVar20) {
      iVar20 = iVar9;
    }
    firstpass_info_00 = &(pAVar6->twopass).firstpass_info;
    for (; search_start_idx < iVar20; search_start_idx = search_start_idx + 1) {
      iVar1 = iVar12 + 1;
      iVar4 = (cpi->ppi->p_rc).enable_scenecut_detection;
      if (((0 < iVar4) && ((cpi->oxcf).kf_cfg.auto_key == true)) &&
         (offset_from_cur = search_start_idx + 1, offset_from_cur < iVar9)) {
        if (iVar1 < (cpi->oxcf).kf_cfg.key_freq_min) {
LAB_001d98e2:
          pFVar14 = av1_firstpass_info_peek(firstpass_info,offset_from_cur);
          dVar22 = get_prediction_decay_rate(pFVar14);
          recent_loop_decay[frame_interval & 7] = dVar22;
          dVar24 = 1.0;
          for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
            dVar24 = dVar24 * recent_loop_decay[lVar19];
          }
          if ((iVar1 < (cpi->oxcf).kf_cfg.key_freq_min) ||
             (iVar12 = detect_transition_to_still
                                 (firstpass_info,offset_from_cur,(cpi->rc).min_gf_interval,
                                  frame_interval,(cpi->oxcf).kf_cfg.key_freq_max - frame_interval,
                                  dVar22,dVar24), iVar12 == 0)) {
            if (offset_from_cur < (cpi->oxcf).kf_cfg.key_freq_max * 2) goto LAB_001d9764;
            bVar7 = false;
            search_start_idx = offset_from_cur;
            goto LAB_001d9979;
          }
          (pAVar6->p_rc).use_arf_in_this_kf_group = 0;
        }
        else {
          aVar5 = (cpi->oxcf).rc_cfg.mode;
          pFVar14 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + -1);
          pFVar15 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx);
          pFVar16 = av1_firstpass_info_peek(firstpass_info_00,offset_from_cur);
          if (pFVar16 == (FIRSTPASS_STATS *)0x0 ||
              (pFVar15 == (FIRSTPASS_STATS *)0x0 || pFVar14 == (FIRSTPASS_STATS *)0x0))
          goto LAB_001d98e2;
          dVar22 = 0.12000000000000001;
          if (iVar12 < 0x1f) {
            dVar22 = ((double)iVar1 / 31.0) * 0.035 + 0.085;
          }
          dVar24 = pFVar15->pcnt_inter;
          dVar21 = dVar24 - pFVar15->pcnt_neutral;
          iVar10 = av1_firstpass_info_future_count(firstpass_info_00,search_start_idx);
          iVar11 = 0x10;
          uVar18 = 3;
          if (iVar4 == 1) {
            iVar11 = 3;
            uVar18 = 1;
            if (iVar10 < 4) goto LAB_001d98e2;
          }
          iVar4 = iVar10 + -1;
          if (iVar11 < iVar10 + -1) {
            iVar4 = iVar11;
          }
          if (((iVar12 < 2) && (aVar5 == AOM_Q)) ||
             ((dVar22 < pFVar15->pcnt_second_ref || dVar22 == pFVar15->pcnt_second_ref ||
              (dVar22 < pFVar16->pcnt_second_ref || dVar22 == pFVar16->pcnt_second_ref))))
          goto LAB_001d98e2;
          if (0.05 < pFVar15->pcnt_inter || pFVar15->pcnt_inter == 0.05) {
            dVar22 = pFVar15->intra_error;
            dVar23 = pFVar15->coded_error;
            if ((((dVar23 * 1.5 <= dVar22) || (dVar23 <= pFVar14->coded_error * 5.0)) ||
                (dVar23 <= pFVar16->coded_error * 5.0)) &&
               ((((dVar24 = 1.0 - dVar24, dVar24 <= 0.25 || (dVar24 <= dVar21 + dVar21)) ||
                 (1.9 <= dVar22 / (*(double *)(&DAT_0043bd90 + (ulong)(dVar23 < 0.0) * 8) + dVar23))
                 ) || (((ABS(pFVar14->coded_error - dVar23) /
                         (*(double *)(&DAT_0043bd90 + (ulong)(dVar23 < 0.0) * 8) + dVar23) <= 0.4 &&
                        (ABS(pFVar14->intra_error - dVar22) /
                         (dVar22 + *(double *)(&DAT_0043bd90 + (ulong)(dVar22 < 0.0) * 8)) <= 0.4))
                       && (pFVar16->intra_error /
                           (pFVar16->coded_error +
                           *(double *)(&DAT_0043bd90 + (ulong)(pFVar16->coded_error < 0.0) * 8)) <=
                           3.5)))))) goto LAB_001d98e2;
          }
          dVar24 = 1.0;
          dVar22 = 0.0;
          for (uVar17 = 1; dVar21 = dVar22, (int)uVar17 <= iVar4; uVar17 = uVar17 + 1) {
            pFVar14 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + uVar17);
            dVar21 = (pFVar14->intra_error * 12.5) /
                     (pFVar14->coded_error +
                     *(double *)(&DAT_0043bd90 + (ulong)(pFVar14->coded_error < 0.0) * 8));
            dVar23 = 128.0;
            if (dVar21 <= 128.0) {
              dVar23 = dVar21;
            }
            dVar2 = pFVar14->pcnt_inter;
            dVar24 = dVar24 * (double)(~-(ulong)(0.85 < dVar2) & (ulong)((dVar2 + 0.85) * 0.5) |
                                      -(ulong)(0.85 < dVar2) & (ulong)dVar2);
            dVar21 = dVar24 * dVar23 + dVar22;
            if (((dVar2 < 0.05) || (dVar23 < 1.5)) ||
               ((pFVar14->intra_error < 200.0 / (double)iVar3 ||
                ((dVar23 < 3.0 && dVar2 - pFVar14->pcnt_neutral < 0.2 || (dVar21 - dVar22 < 3.0)))))
               ) break;
            dVar22 = dVar21;
          }
          if ((uVar17 <= uVar18) || (dVar21 <= 30.0)) goto LAB_001d98e2;
        }
        bVar7 = true;
        goto LAB_001d9979;
      }
LAB_001d9764:
      frame_interval = frame_interval + 1;
      iVar12 = iVar1;
    }
    bVar7 = false;
LAB_001d9979:
    if (cpi->ppi->lap_enabled == 0) {
      iVar8 = search_start_idx;
    }
    if (bVar7) {
      iVar8 = search_start_idx;
    }
  }
  return iVar8;
}

Assistant:

static int define_kf_interval(AV1_COMP *cpi,
                              const FIRSTPASS_INFO *firstpass_info,
                              int num_frames_to_detect_scenecut,
                              int search_start_idx) {
  const TWO_PASS *const twopass = &cpi->ppi->twopass;
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const KeyFrameCfg *const kf_cfg = &oxcf->kf_cfg;
  double recent_loop_decay[FRAMES_TO_CHECK_DECAY];
  double decay_accumulator = 1.0;
  int i = 0, j;
  int frames_to_key = search_start_idx;
  int frames_since_key = rc->frames_since_key + 1;
  int scenecut_detected = 0;

  int num_frames_to_next_key = detect_app_forced_key(cpi);

  if (num_frames_to_detect_scenecut == 0) {
    if (num_frames_to_next_key != -1)
      return num_frames_to_next_key;
    else
      return rc->frames_to_key;
  }

  if (num_frames_to_next_key != -1)
    num_frames_to_detect_scenecut =
        AOMMIN(num_frames_to_detect_scenecut, num_frames_to_next_key);

  // Initialize the decay rates for the recent frames to check
  for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j) recent_loop_decay[j] = 1.0;

  i = 0;
  const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                          ? cpi->initial_mbs
                          : cpi->common.mi_params.MBs;
  const int future_stats_count =
      av1_firstpass_info_future_count(firstpass_info, 0);
  while (frames_to_key < future_stats_count &&
         frames_to_key < num_frames_to_detect_scenecut) {
    // Provided that we are not at the end of the file...
    if ((cpi->ppi->p_rc.enable_scenecut_detection > 0) && kf_cfg->auto_key &&
        frames_to_key + 1 < future_stats_count) {
      double loop_decay_rate;

      // Check for a scene cut.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = test_candidate_kf(
            &twopass->firstpass_info, frames_to_key, frames_since_key,
            oxcf->rc_cfg.mode, cpi->ppi->p_rc.enable_scenecut_detection,
            num_mbs);
        if (scenecut_detected) {
          break;
        }
      }

      // How fast is the prediction quality decaying?
      const FIRSTPASS_STATS *next_stats =
          av1_firstpass_info_peek(firstpass_info, frames_to_key + 1);
      loop_decay_rate = get_prediction_decay_rate(next_stats);

      // We want to know something about the recent past... rather than
      // as used elsewhere where we are concerned with decay in prediction
      // quality since the last GF or KF.
      recent_loop_decay[i % FRAMES_TO_CHECK_DECAY] = loop_decay_rate;
      decay_accumulator = 1.0;
      for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j)
        decay_accumulator *= recent_loop_decay[j];

      // Special check for transition or high motion followed by a
      // static scene.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = detect_transition_to_still(
            firstpass_info, frames_to_key + 1, rc->min_gf_interval, i,
            kf_cfg->key_freq_max - i, loop_decay_rate, decay_accumulator);
        if (scenecut_detected) {
          // In the case of transition followed by a static scene, the key frame
          // could be a good predictor for the following frames, therefore we
          // do not use an arf.
          p_rc->use_arf_in_this_kf_group = 0;
          break;
        }
      }

      // Step on to the next frame.
      ++frames_to_key;
      ++frames_since_key;

      // If we don't have a real key frame within the next two
      // key_freq_max intervals then break out of the loop.
      if (frames_to_key >= 2 * kf_cfg->key_freq_max) {
        break;
      }
    } else {
      ++frames_to_key;
      ++frames_since_key;
    }
    ++i;
  }
  if (cpi->ppi->lap_enabled && !scenecut_detected)
    frames_to_key = num_frames_to_next_key;

  return frames_to_key;
}